

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O0

void __thiscall
ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *this,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list)

{
  bool bVar1;
  size_type size_00;
  reference ppEVar2;
  Expression *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__range2;
  size_t i;
  size_t size;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *list_local;
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_local;
  
  size_00 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::size(list);
  if (*(ulong *)(this + 0x10) < size_00) {
    ArenaVector<wasm::Expression_*>::allocate((ArenaVector<wasm::Expression_*> *)this,size_00);
  }
  __range2 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)0x0;
  __end0 = std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::begin(list);
  elem = (Expression *)
         std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::end(list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
                                *)&elem);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
              ::operator*(&__end0);
    *(Expression **)(*(long *)this + (long)__range2 * 8) = *ppEVar2;
    __gnu_cxx::
    __normal_iterator<wasm::Expression_*const_*,_std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>_>
    ::operator++(&__end0);
    __range2 = (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
               ((long)&(__range2->
                       super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + 1);
  }
  *(size_type *)(this + 8) = size_00;
  return;
}

Assistant:

void set(const ListType& list) {
    size_t size = list.size();
    if (allocatedElements < size) {
      static_cast<SubType*>(this)->allocate(size);
    }
    size_t i = 0;
    for (auto elem : list) {
      data[i++] = elem;
    }
    usedElements = size;
  }